

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

void Kit_DsdDecompose_rec
               (Kit_DsdNtk_t *pNtk,Kit_DsdObj_t *pObj,uint uSupp,unsigned_short *pPar,int nDecMux)

{
  Kit_DsdObj_t *pPar_00;
  uint *pOut;
  uint *pOut_00;
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined2 uVar4;
  unsigned_short uVar5;
  uint uVar6;
  Kit_DsdObj_t KVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint *puVar13;
  Kit_DsdObj_t *pKVar14;
  Kit_DsdObj_t *pKVar15;
  byte bVar16;
  ushort uVar17;
  uint uVar18;
  long lVar19;
  undefined4 *puVar20;
  int iVar21;
  long lVar23;
  uint *pOut_01;
  uint *pOut_02;
  int i;
  uint uVar24;
  undefined2 uVar25;
  int iVar26;
  ulong uVar27;
  uint *pOut_03;
  undefined1 *puVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  uint *pTruth;
  int i_1;
  uint uVar39;
  int iVar40;
  undefined1 auVar38 [16];
  uint local_d0;
  uint local_cc;
  int local_6c;
  Kit_DsdObj_t local_5c;
  ulong uVar22;
  
  do {
    pPar_00 = pObj + 1;
    local_d0 = uSupp;
LAB_0055b97c:
    KVar7 = *pObj;
    bVar16 = (KVar7._3_1_ >> 2) - 5;
    iVar8 = 5 << (bVar16 & 0x1f);
    if ((uint)KVar7 < 0x18000000) {
      iVar8 = 5;
    }
    iVar40 = 3 << (bVar16 & 0x1f);
    if ((uint)KVar7 < 0x18000000) {
      iVar40 = 3;
    }
    iVar31 = 1 << (bVar16 & 0x1f);
    if ((uint)KVar7 < 0x18000000) {
      iVar31 = 1;
    }
    puVar13 = (uint *)((long)&pPar_00->field_0x0 + (ulong)((uint)KVar7 >> 8 & 0x3fc));
    pTruth = (uint *)0x0;
    if (((uint)KVar7 & 0x1c0) == 0x140) {
      pTruth = puVar13;
    }
    if ((uint)KVar7 < 0x4000000) {
      __assert_fail("pObj->nFans > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x7be,
                    "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                   );
    }
    if (((uint)KVar7 & 0x1c0) != 0x140) {
      __assert_fail("pObj->Type == KIT_DSD_PRIME",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x7bf,
                    "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                   );
    }
    pOut_00 = pNtk->pMem;
    uVar6 = Kit_TruthSupport(puVar13,(uint)KVar7 >> 0x1a);
    if (uVar6 != local_d0) {
      __assert_fail("uSupp == (uSupp0 = (unsigned)Kit_TruthSupport(pTruth, pObj->nFans))",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x7c0,
                    "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                   );
    }
    KVar7 = *pObj;
    if (0x83ffffff < (uint)KVar7) {
LAB_0055cceb:
      __assert_fail("nBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                    ,0xe4,"unsigned int Kit_BitMask(int)");
    }
    if ((-1 << (KVar7._3_1_ >> 2 & 0x1f) ^ local_d0) != 0xffffffff) {
      uVar6 = (local_d0 >> 1 & 0x55555555) + (local_d0 & 0x55555555);
      uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
      uVar6 = (uVar6 >> 4 & 0x7070707) + (uVar6 & 0x7070707);
      uVar6 = (uVar6 >> 8 & 0xf000f) + (uVar6 & 0xf000f);
      uVar24 = (uVar6 >> 0x10) + (uVar6 & 0xffff);
      Kit_TruthShrink(pNtk->pMem,puVar13,uVar24,(uint)KVar7 >> 0x1a,local_d0,1);
      KVar7 = *pObj;
      uVar6 = 0;
      if (0x3ffffff < (uint)KVar7) {
        uVar27 = 0;
        uVar6 = 0;
        do {
          if ((local_d0 >> ((uint)uVar27 & 0x1f) & 1) != 0) {
            uVar12 = (ulong)uVar6;
            uVar6 = uVar6 + 1;
            *(unsigned_short *)((long)&pPar_00->field_0x0 + uVar12 * 2) =
                 *(unsigned_short *)((long)&pPar_00->field_0x0 + uVar27 * 2);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 < (uint)KVar7 >> 0x1a);
      }
      if (uVar6 != uVar24) {
        __assert_fail("k == nFansNew",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x7ca,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      KVar7 = (Kit_DsdObj_t)((uint)KVar7 & 0x3ffffff | uVar24 * 0x4000000);
      *pObj = KVar7;
      if (0x20 < uVar24) goto LAB_0055cceb;
      local_d0 = ~(-1 << ((byte)uVar24 & 0x1f));
    }
    uVar6 = (uint)KVar7 >> 0x1a;
    if (uVar6 == 1) {
      *pObj = (Kit_DsdObj_t)((uint)KVar7 & 0x7fffe3f);
      if (*pTruth == 0x55555555) {
        uVar5 = SUB42(*pPar_00,0) ^ 1;
        *(unsigned_short *)pPar_00 = uVar5;
      }
      else {
        if (*pTruth != 0xaaaaaaaa) {
          __assert_fail("pTruth[0] == 0xAAAAAAAA",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x7d6,
                        "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                       );
        }
        uVar5 = *(unsigned_short *)pPar_00;
      }
      *pPar = uVar5 ^ *pPar & 1;
      return;
    }
    puVar13 = pOut_00 + iVar31;
    local_cc = uVar6;
    if (((uint)KVar7 >> 9 & 1) == 0) {
LAB_0055bb6e:
      KVar7 = *pObj;
      uVar6 = (uint)KVar7 >> 0x1a;
      if ((int)local_cc < 1) goto LAB_0055bd00;
      local_cc = local_cc - 1;
      Kit_TruthCofactor0New(pOut_00,pTruth,uVar6,local_cc);
      Kit_TruthCofactor1New(puVar13,pTruth,(uint)*pObj >> 0x1a,local_cc);
      KVar7 = *pObj;
      uVar27 = (ulong)(uint)(1 << ((KVar7._3_1_ >> 2) - 5 & 0x1f));
      uVar12 = uVar27;
      if ((uint)KVar7 < 0x18000000) {
        uVar27 = 1;
        uVar12 = uVar27;
      }
      do {
        iVar26 = (int)uVar27;
        uVar22 = uVar12;
        if (iVar26 < 1) {
          iVar35 = 1;
          goto LAB_0055bbf0;
        }
        lVar11 = uVar27 - 1;
        uVar27 = uVar27 - 1;
      } while (pOut_00[lVar11] == 0);
      iVar35 = 0;
LAB_0055bbf0:
      do {
        iVar21 = (int)uVar22;
        uVar27 = uVar12;
        if (iVar21 < 1) {
          iVar37 = 1;
          goto LAB_0055bc0e;
        }
        lVar11 = uVar22 - 1;
        uVar22 = uVar22 - 1;
      } while (pOut_00[iVar31 + lVar11] == 0);
      iVar37 = 0;
LAB_0055bc0e:
      do {
        iVar29 = (int)uVar27;
        uVar22 = uVar12;
        if (iVar29 < 1) {
          iVar30 = 1;
          goto LAB_0055bc2c;
        }
        lVar11 = uVar27 - 1;
        uVar27 = uVar27 - 1;
      } while (pOut_00[lVar11] == 0xffffffff);
      iVar30 = 0;
LAB_0055bc2c:
      do {
        iVar33 = (int)uVar22;
        uVar27 = uVar12;
        if (iVar33 < 1) {
          iVar34 = 1;
          goto LAB_0055bc4d;
        }
        lVar11 = uVar22 - 1;
        uVar22 = uVar22 - 1;
      } while (pOut_00[iVar31 + lVar11] == 0xffffffff);
      iVar34 = 0;
LAB_0055bc4d:
      do {
        iVar36 = (int)uVar27;
        if (iVar36 < 1) {
          bVar1 = true;
          goto LAB_0055bc77;
        }
        lVar11 = uVar27 - 1;
        lVar19 = uVar27 - 1;
        uVar27 = uVar27 - 1;
      } while ((pOut_00[iVar31 + lVar11] ^ pOut_00[lVar19]) == 0xffffffff);
      bVar1 = false;
LAB_0055bc77:
      do {
        if ((int)uVar12 < 1) {
          __assert_fail("!Kit_TruthIsEqual(pCofs2[0], pCofs2[1], pObj->nFans)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x7eb,
                        "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                       );
        }
        lVar11 = uVar12 - 1;
        lVar19 = uVar12 - 1;
        uVar12 = uVar12 - 1;
      } while (pOut_00[lVar11] == pOut_00[iVar31 + lVar19]);
      if (bVar1 || iVar30 + iVar34 + iVar37 + iVar35 != 0) {
        pKVar14 = Kit_DsdObjAlloc(pNtk,KIT_DSD_AND,2);
        *pKVar14 = (Kit_DsdObj_t)
                   (((uint)*pKVar14 & 0x3ffff) + ((int)*pKVar14 + 0x40000U & 0x3fc0000) + 0x8000000)
        ;
        *(undefined2 *)(pKVar14 + 1) =
             *(undefined2 *)((long)&pObj[1].field_0x0 + (ulong)local_cc * 2);
        *(undefined2 *)((long)&pObj[1].field_0x0 + (ulong)local_cc * 2) = 0x7f;
        puVar28 = &pKVar14[1].field_0x2;
        *(ushort *)&pKVar14[1].field_0x2 = SUB42(*pObj,0) * 2 & 0x7e;
        uVar17 = (*pPar & 1) + (SUB42(*pKVar14,0) & 0x3f) * 2;
        *pPar = uVar17;
        if (iVar26 < 1) {
          uVar6 = 1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f);
          if ((uint)*pObj < 0x18000000) {
            uVar6 = 1;
          }
          if (0 < (int)uVar6) {
            uVar27 = (ulong)uVar6 + 1;
            do {
              pTruth[uVar27 - 2] = puVar13[uVar27 - 2];
              uVar27 = uVar27 - 1;
            } while (1 < uVar27);
          }
        }
        else if (iVar21 < 1) {
          *(byte *)(pKVar14 + 1) = *(byte *)(pKVar14 + 1) ^ 1;
          uVar6 = 1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f);
          if ((uint)*pObj < 0x18000000) {
            uVar6 = 1;
          }
          if (0 < (int)uVar6) {
            uVar27 = (ulong)uVar6 + 1;
            do {
              pTruth[uVar27 - 2] = pOut_00[uVar27 - 2];
              uVar27 = uVar27 - 1;
            } while (1 < uVar27);
          }
        }
        else if (iVar29 < 1) {
          *pPar = uVar17 ^ 1;
          *puVar28 = *puVar28 ^ 1;
          uVar6 = 1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f);
          if ((uint)*pObj < 0x18000000) {
            uVar6 = 1;
          }
          if (0 < (int)uVar6) {
            uVar27 = (ulong)uVar6 + 1;
            do {
              pTruth[uVar27 - 2] = puVar13[uVar27 - 2];
              uVar27 = uVar27 - 1;
            } while (1 < uVar27);
          }
        }
        else if (iVar33 < 1) {
          *pPar = uVar17 ^ 1;
          pKVar14[1] = (Kit_DsdObj_t)((uint)pKVar14[1] ^ 0x10001);
          uVar6 = 1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f);
          if ((uint)*pObj < 0x18000000) {
            uVar6 = 1;
          }
          if (0 < (int)uVar6) {
            uVar27 = (ulong)uVar6 + 1;
            do {
              pTruth[uVar27 - 2] = pOut_00[uVar27 - 2];
              uVar27 = uVar27 - 1;
            } while (1 < uVar27);
          }
        }
        else {
          if (0 < iVar36) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                          ,0x830,
                          "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                         );
          }
          *pKVar14 = (Kit_DsdObj_t)((uint)*pKVar14 & 0xfffffe3f | 0x100);
          uVar6 = 1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f);
          if ((uint)*pObj < 0x18000000) {
            uVar6 = 1;
          }
          if (0 < (int)uVar6) {
            uVar27 = (ulong)uVar6 + 1;
            do {
              pTruth[uVar27 - 2] = pOut_00[uVar27 - 2];
              uVar27 = uVar27 - 1;
            } while (1 < uVar27);
          }
        }
        local_d0 = local_d0 & ~(1 << (local_cc & 0x1f));
        puVar13 = (uint *)((long)&pPar_00->field_0x0 + (ulong)((uint)*pObj >> 8 & 0x3fc));
        if (((uint)*pObj & 0x1c0) != 0x140) {
          puVar13 = (uint *)0x0;
        }
        pPar = (unsigned_short *)puVar28;
        if (puVar13 != pTruth) {
          __assert_fail("Kit_DsdObjTruth(pObj) == pTruth",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x832,
                        "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                       );
        }
        goto LAB_0055b97c;
      }
      uVar6 = Kit_TruthSupport(pOut_00,(uint)KVar7 >> 0x1a);
      uSupp = Kit_TruthSupport(puVar13,(uint)*pObj >> 0x1a);
      if (local_d0 != (uVar6 | 1 << (local_cc & 0x1f) | uSupp)) {
        __assert_fail("uSupp == (uSupp0 | uSupp1 | (1<<i))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x7f1,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      if ((uSupp & uVar6) != 0) goto LAB_0055bb6e;
      pKVar14 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      pKVar15 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      KVar7 = *pObj;
      if ((uint)KVar7 < 0x4000000) {
        uVar12 = (ulong)((uint)KVar7 >> 0x1a);
      }
      else {
        uVar27 = 0;
        do {
          uVar4 = 0x7f;
          uVar25 = 0x7f;
          if ((uVar6 >> ((uint)uVar27 & 0x1f) & 1) != 0) {
            uVar25 = *(undefined2 *)((long)&pObj[1].field_0x0 + uVar27 * 2);
          }
          *(undefined2 *)(&pKVar14[1].field_0x0 + uVar27 * 2) = uVar25;
          if ((1 << ((byte)uVar27 & 0x1f) & uSupp) != 0) {
            uVar4 = *(undefined2 *)((long)&pObj[1].field_0x0 + uVar27 * 2);
          }
          *(undefined2 *)(&pKVar15[1].field_0x0 + uVar27 * 2) = uVar4;
          uVar27 = uVar27 + 1;
          KVar7 = *pObj;
          uVar12 = (ulong)((uint)KVar7 >> 0x1a);
        } while (uVar27 < uVar12);
      }
      puVar28 = &pKVar14[1].field_0x0 + ((uint)*pKVar14 >> 8 & 0x3fc);
      if (((uint)*pKVar14 & 0x1c0) != 0x140) {
        puVar28 = (undefined1 *)0x0;
      }
      uVar24 = 1 << ((char)uVar12 - 5U & 0x1f);
      if ((uint)KVar7 < 0x18000000) {
        uVar24 = 1;
      }
      if (0 < (int)uVar24) {
        uVar27 = (ulong)uVar24 + 1;
        do {
          *(uint *)(puVar28 + uVar27 * 4 + -8) = pOut_00[uVar27 - 2];
          uVar27 = uVar27 - 1;
        } while (1 < uVar27);
        KVar7 = *pObj;
      }
      puVar28 = &pKVar15[1].field_0x0 + ((uint)*pKVar15 >> 8 & 0x3fc);
      if (((uint)*pKVar15 & 0x1c0) != 0x140) {
        puVar28 = (undefined1 *)0x0;
      }
      uVar24 = 1 << ((KVar7._3_1_ >> 2) - 5 & 0x1f);
      if ((uint)KVar7 < 0x18000000) {
        uVar24 = 1;
      }
      if (0 < (int)uVar24) {
        uVar27 = (ulong)uVar24 + 1;
        do {
          *(uint *)(puVar28 + uVar27 * 4 + -8) = puVar13[uVar27 - 2];
          uVar27 = uVar27 - 1;
        } while (1 < uVar27);
        KVar7 = *pObj;
      }
      if (((uint)KVar7 & 0x1c0) != 0x140) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x7ff,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      *pTruth = 0xcacacaca;
      *pObj = (Kit_DsdObj_t)((uint)KVar7 & 0x3ffff7f | 0xc000000);
      *(undefined2 *)(pObj + 2) = *(undefined2 *)((long)&pObj[1].field_0x0 + (ulong)local_cc * 2);
      *(ushort *)(pObj + 1) = SUB42(*pKVar14,0) * 2 & 0x7e;
      *pKVar14 = (Kit_DsdObj_t)((uint)*pKVar14 & 0xfc03ffff | (int)*pKVar14 + 0x40000U & 0x3fc0000);
      *(ushort *)&pObj[1].field_0x2 = SUB42(*pKVar15,0) * 2 & 0x7e;
      pPar = (unsigned_short *)&pObj[1].field_0x2;
      *pKVar15 = (Kit_DsdObj_t)((uint)*pKVar15 & 0xfc03ffff | (int)*pKVar15 + 0x40000U & 0x3fc0000);
      Kit_DsdDecompose_rec(pNtk,pKVar14,uVar6,(unsigned_short *)pPar_00,nDecMux);
      pObj = pKVar15;
    }
    else {
LAB_0055bd00:
      local_5c = (Kit_DsdObj_t)((uint)KVar7 | 0x200);
      *pObj = local_5c;
      if (0x3ffffff < (uint)KVar7) {
        lVar11 = (long)(iVar31 * 2);
        pOut = pOut_00 + lVar11;
        lVar19 = (long)iVar40;
        pOut_01 = pOut_00 + lVar19;
        lVar23 = (long)(iVar31 << 2);
        pOut_02 = pOut_00 + lVar23;
        lVar32 = (long)iVar8;
        pOut_03 = pOut_00 + lVar32;
        do {
          uVar24 = uVar6 - 1;
          iVar8 = Kit_TruthVarInSupport(pTruth,(uint)local_5c >> 0x1a,uVar24);
          if (iVar8 == 0) {
            __assert_fail("Kit_TruthVarInSupport( pTruth, pObj->nFans, i )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                          ,0x83b,
                          "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                         );
          }
          Kit_TruthCofactor0New(pOut_00,pTruth,(uint)*pObj >> 0x1a,uVar24);
          Kit_TruthCofactor1New(puVar13,pTruth,(uint)*pObj >> 0x1a,uVar24);
          uVar9 = Kit_TruthSupport(pOut_00,(uint)*pObj >> 0x1a);
          uVar10 = Kit_TruthSupport(puVar13,(uint)*pObj >> 0x1a);
          if (local_d0 != (uVar9 | 1 << (uVar24 & 0x1f) | uVar10)) {
            __assert_fail("uSupp == (uSupp0 | uSupp1 | (1<<i))",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                          ,0x842,
                          "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                         );
          }
          if ((uVar9 == 0) || (uVar10 == 0)) {
            pObj->field_0x1 = pObj->field_0x1 & 0xfd;
            goto LAB_0055b97c;
          }
          uVar18 = ~uVar10 & uVar9;
          uVar10 = ~uVar9 & uVar10;
          uVar9 = (uVar10 & 0x55555555) + (uVar10 >> 1 & 0x55555555);
          uVar39 = (uVar18 & 0x55555555) + (uVar18 >> 1 & 0x55555555);
          uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333);
          uVar39 = (uVar39 >> 2 & 0x33333333) + (uVar39 & 0x33333333);
          uVar9 = (uVar9 >> 4 & 0x7070707) + (uVar9 & 0x7070707);
          uVar39 = (uVar39 >> 4 & 0x7070707) + (uVar39 & 0x7070707);
          uVar9 = (uVar9 >> 8 & 0xf000f) + (uVar9 & 0xf000f);
          uVar39 = (uVar39 >> 8 & 0xf000f) + (uVar39 & 0xf000f);
          iVar8 = (uVar9 >> 0x10) + (uVar9 & 0x1f);
          iVar40 = (uVar39 >> 0x10) + (uVar39 & 0x1f);
          auVar38._0_4_ = -(uint)(iVar8 == 1);
          auVar38._4_4_ = -(uint)(iVar8 == 1);
          auVar38._8_4_ = -(uint)(iVar40 == 1);
          auVar38._12_4_ = -(uint)(iVar40 == 1);
          iVar8 = movmskpd(uVar10 & 0x55555555,auVar38);
          if (iVar8 == 3) {
            uVar9 = 0;
            do {
              if ((uVar18 >> (uVar9 & 0x1f) & 1) != 0) goto LAB_0055bf1d;
              uVar9 = uVar9 + 1;
            } while (uVar9 != 0x20);
            uVar9 = 0xffffffff;
LAB_0055bf1d:
            uVar18 = 0;
            do {
              if ((uVar10 >> (uVar18 & 0x1f) & 1) != 0) goto LAB_0055bf35;
              uVar18 = uVar18 + 1;
            } while (uVar18 != 0x20);
            uVar18 = 0xffffffff;
LAB_0055bf35:
            Kit_TruthCofactor0New(pOut,pOut_00,(uint)*pObj >> 0x1a,uVar9);
            Kit_TruthCofactor1New(pOut_01,pOut_00,(uint)*pObj >> 0x1a,uVar9);
            Kit_TruthCofactor0New(pOut_02,puVar13,(uint)*pObj >> 0x1a,uVar18);
            Kit_TruthCofactor1New(pOut_03,puVar13,(uint)*pObj >> 0x1a,uVar18);
            local_5c = *pObj;
            uVar12 = (ulong)(uint)(1 << ((local_5c._3_1_ >> 2) - 5 & 0x1f));
            uVar27 = uVar12;
            if ((uint)local_5c < 0x18000000) {
              uVar12 = 1;
              uVar27 = uVar12;
            }
            do {
              iVar8 = (int)uVar12;
              uVar22 = uVar27;
              if (iVar8 < 1) break;
              lVar2 = uVar12 - 1;
              lVar3 = uVar12 - 1;
              uVar12 = uVar12 - 1;
            } while (pOut_00[lVar11 + lVar2] == pOut_00[lVar23 + lVar3]);
            do {
              iVar40 = (int)uVar22;
              uVar12 = uVar27;
              if (iVar40 < 1) break;
              lVar2 = uVar22 - 1;
              lVar3 = uVar22 - 1;
              uVar22 = uVar22 - 1;
            } while (pOut_00[lVar19 + lVar2] == pOut_00[lVar32 + lVar3]);
            do {
              iVar31 = (int)uVar12;
              if (iVar31 < 1) break;
              lVar2 = uVar12 - 1;
              lVar3 = uVar12 - 1;
              uVar12 = uVar12 - 1;
            } while (pOut_00[lVar11 + lVar2] == pOut_00[lVar32 + lVar3]);
            do {
              iVar26 = (int)uVar27;
              if (iVar26 < 1) break;
              lVar2 = uVar27 - 1;
              lVar3 = uVar27 - 1;
              uVar27 = uVar27 - 1;
            } while (pOut_00[lVar19 + lVar2] == pOut_00[lVar23 + lVar3]);
            if ((iVar8 < 1 && iVar40 < 1) || (iVar31 < 1 && iVar26 < 1)) goto LAB_0055c43b;
          }
          else {
            local_5c = *pObj;
          }
          uVar10 = (uint)local_5c >> 0x1a;
          uVar9 = uVar6;
          if (uVar6 < uVar10) {
            do {
              Kit_TruthCofactor0New(pOut,pOut_00,uVar10,uVar9);
              Kit_TruthCofactor1New(pOut_01,pOut_00,(uint)*pObj >> 0x1a,uVar9);
              Kit_TruthCofactor0New(pOut_02,puVar13,(uint)*pObj >> 0x1a,uVar9);
              Kit_TruthCofactor1New(pOut_03,puVar13,(uint)*pObj >> 0x1a,uVar9);
              local_5c = *pObj;
              uVar10 = (uint)local_5c >> 0x1a;
              uVar12 = (ulong)(uint)(1 << ((local_5c._3_1_ >> 2) - 5 & 0x1f));
              uVar27 = uVar12;
              if ((uint)local_5c < 0x18000000) {
                uVar12 = 1;
                uVar27 = uVar12;
              }
              do {
                iVar8 = (int)uVar12;
                uVar22 = uVar27;
                if (iVar8 < 1) {
                  iVar40 = -3;
                  goto LAB_0055c143;
                }
                lVar2 = uVar12 - 1;
                lVar3 = uVar12 - 1;
                uVar12 = uVar12 - 1;
              } while (pOut_00[lVar11 + lVar2] == pOut_00[lVar19 + lVar3]);
              iVar40 = -4;
LAB_0055c143:
              do {
                iVar31 = (int)uVar22;
                uVar12 = uVar27;
                if (iVar31 < 1) {
                  iVar26 = 1;
                  goto LAB_0055c166;
                }
                lVar2 = uVar22 - 1;
                lVar3 = uVar22 - 1;
                uVar22 = uVar22 - 1;
              } while (pOut_00[lVar11 + lVar2] == pOut_00[lVar23 + lVar3]);
              iVar26 = 0;
LAB_0055c166:
              do {
                iVar35 = (int)uVar12;
                uVar22 = uVar27;
                if (iVar35 < 1) {
                  iVar21 = 1;
                  goto LAB_0055c192;
                }
                lVar2 = uVar12 - 1;
                lVar3 = uVar12 - 1;
                uVar12 = uVar12 - 1;
              } while (pOut_00[lVar11 + lVar2] == pOut_00[lVar32 + lVar3]);
              iVar21 = 0;
LAB_0055c192:
              do {
                iVar37 = (int)uVar22;
                uVar12 = uVar27;
                if (iVar37 < 1) {
                  local_6c = 1;
                  goto LAB_0055c1c0;
                }
                lVar2 = uVar22 - 1;
                lVar3 = uVar22 - 1;
                uVar22 = uVar22 - 1;
              } while (pOut_00[lVar19 + lVar2] == pOut_00[lVar23 + lVar3]);
              local_6c = 0;
LAB_0055c1c0:
              do {
                iVar29 = (int)uVar12;
                if (iVar29 < 1) {
                  iVar30 = 1;
                  goto LAB_0055c1e9;
                }
                lVar2 = uVar12 - 1;
                lVar3 = uVar12 - 1;
                uVar12 = uVar12 - 1;
              } while (pOut_00[lVar19 + lVar2] == pOut_00[lVar32 + lVar3]);
              iVar30 = 0;
LAB_0055c1e9:
              do {
                if ((int)uVar27 < 1) {
                  iVar33 = 1;
                  goto LAB_0055c211;
                }
                lVar2 = uVar27 - 1;
                lVar3 = uVar27 - 1;
                uVar27 = uVar27 - 1;
              } while (pOut_00[lVar23 + lVar2] == pOut_00[lVar32 + lVar3]);
              iVar33 = 0;
LAB_0055c211:
              if (0xfffffffd < (uint)(iVar21 + local_6c + iVar40 + iVar26 + iVar30 + iVar33)) {
                pKVar14 = Kit_DsdObjAlloc(pNtk,KIT_DSD_AND,2);
                KVar7 = *pKVar14;
                *pKVar14 = (Kit_DsdObj_t)
                           (((int)KVar7 + 0x40000U & 0x3fc0000) + ((uint)KVar7 & 0x3ffff) +
                           0x8000000);
                *(unsigned_short *)(pKVar14 + 1) =
                     *(unsigned_short *)((long)&pPar_00->field_0x0 + (ulong)uVar9 * 2);
                *(ushort *)((long)&pPar_00->field_0x0 + (ulong)uVar9 * 2) = KVar7._0_2_ * 2 & 0x7e;
                *(unsigned_short *)&pKVar14[1].field_0x2 =
                     *(unsigned_short *)((long)&pPar_00->field_0x0 + (ulong)uVar24 * 2);
                *(unsigned_short *)((long)&pPar_00->field_0x0 + (ulong)uVar24 * 2) = 0x7f;
                local_d0 = local_d0 & ~(1 << ((byte)uVar24 & 0x1f));
                if ((iVar8 < 1 || iVar31 < 1) || iVar35 < 1) {
                  if ((iVar8 < 1 || iVar37 < 1) || iVar29 < 1) {
                    if (((char)local_6c == '\0' && (char)iVar33 == '\0') && 0 < iVar31) {
                      *(byte *)(pKVar14 + 1) = *(byte *)(pKVar14 + 1) ^ 1;
                      uVar6 = (uint)*pObj >> 0x1a;
                    }
                    else if (((char)iVar33 == '\0' && (char)iVar30 == '\0') && 0 < iVar35) {
                      uVar6 = (uint)*pObj >> 0x1a;
                      pOut_02 = pOut_03;
                    }
                    else {
                      if ((0 < iVar35) || (0 < iVar37)) {
                        __assert_fail("fPairs[0][3] && fPairs[1][2]",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                                      ,0x8ab,
                                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                                     );
                      }
                      *pKVar14 = (Kit_DsdObj_t)((uint)*pKVar14 & 0xfffffe3f | 0x100);
                      uVar6 = (uint)*pObj >> 0x1a;
                      pOut_02 = pOut_01;
                    }
                    Kit_TruthMuxVar(pTruth,pOut,pOut_02,uVar6,uVar9);
                    goto LAB_0055b97c;
                  }
                  pKVar14[1].field_0x2 = pKVar14[1].field_0x2 ^ 1;
                  KVar7 = *pObj;
                  pOut_03 = pOut;
                }
                else {
                  pKVar14[1] = (Kit_DsdObj_t)((uint)pKVar14[1] ^ 0x10001);
                  KVar7 = *pObj;
                  pOut_01 = pOut;
                }
                Kit_TruthMuxVar(pTruth,pOut_03,pOut_01,(uint)KVar7 >> 0x1a,uVar9);
                goto LAB_0055b97c;
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 < uVar10);
          }
          bVar1 = (int)uVar6 < 2;
          uVar6 = uVar24;
          if (bVar1) break;
        } while( true );
      }
      if ((nDecMux < 1) || ((uint)local_5c >> 0x1a <= (uint)nDecMux)) {
        return;
      }
      iVar8 = Kit_TruthBestCofVar(pTruth,(uint)local_5c >> 0x1a,pOut_00,puVar13);
      uVar6 = Kit_TruthSupport(pOut_00,(uint)*pObj >> 0x1a);
      uSupp = Kit_TruthSupport(puVar13,(uint)*pObj >> 0x1a);
      pKVar14 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      pKVar15 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      KVar7 = *pObj;
      if ((uint)KVar7 < 0x4000000) {
        uVar12 = (ulong)((uint)KVar7 >> 0x1a);
      }
      else {
        uVar27 = 0;
        do {
          uVar25 = *(undefined2 *)((long)&pObj[1].field_0x0 + uVar27 * 2);
          *(undefined2 *)(&pKVar15[1].field_0x0 + uVar27 * 2) = uVar25;
          *(undefined2 *)(&pKVar14[1].field_0x0 + uVar27 * 2) = uVar25;
          uVar27 = uVar27 + 1;
          KVar7 = *pObj;
          uVar12 = (ulong)((uint)KVar7 >> 0x1a);
        } while (uVar27 < uVar12);
      }
      puVar28 = &pKVar14[1].field_0x0 + ((uint)*pKVar14 >> 8 & 0x3fc);
      if (((uint)*pKVar14 & 0x1c0) != 0x140) {
        puVar28 = (undefined1 *)0x0;
      }
      uVar24 = 1 << ((char)uVar12 - 5U & 0x1f);
      if ((uint)KVar7 < 0x18000000) {
        uVar24 = 1;
      }
      if (0 < (int)uVar24) {
        uVar27 = (ulong)uVar24 + 1;
        do {
          *(uint *)(puVar28 + uVar27 * 4 + -8) = pOut_00[uVar27 - 2];
          uVar27 = uVar27 - 1;
        } while (1 < uVar27);
        KVar7 = *pObj;
      }
      puVar28 = &pKVar15[1].field_0x0 + ((uint)*pKVar15 >> 8 & 0x3fc);
      if (((uint)*pKVar15 & 0x1c0) != 0x140) {
        puVar28 = (undefined1 *)0x0;
      }
      uVar24 = 1 << ((KVar7._3_1_ >> 2) - 5 & 0x1f);
      if ((uint)KVar7 < 0x18000000) {
        uVar24 = 1;
      }
      if (0 < (int)uVar24) {
        uVar27 = (ulong)uVar24 + 1;
        do {
          *(uint *)(puVar28 + uVar27 * 4 + -8) = puVar13[uVar27 - 2];
          uVar27 = uVar27 - 1;
        } while (1 < uVar27);
        KVar7 = *pObj;
      }
      if (((uint)KVar7 & 0x1c0) != 0x140) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x8c3,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      *pTruth = 0xcacacaca;
      *pObj = (Kit_DsdObj_t)((uint)KVar7 & 0x3ffff7f | 0xc000000);
      *(undefined2 *)(pObj + 2) = *(undefined2 *)((long)&pObj[1].field_0x0 + (long)iVar8 * 2);
      *(ushort *)(pObj + 1) = SUB42(*pKVar14,0) * 2 & 0x7e;
      *pKVar14 = (Kit_DsdObj_t)((uint)*pKVar14 & 0xfc03ffff | (int)*pKVar14 + 0x40000U & 0x3fc0000);
      *(ushort *)&pObj[1].field_0x2 = SUB42(*pKVar15,0) * 2 & 0x7e;
      pPar = (unsigned_short *)&pObj[1].field_0x2;
      *pKVar15 = (Kit_DsdObj_t)((uint)*pKVar15 & 0xfc03ffff | (int)*pKVar15 + 0x40000U & 0x3fc0000);
      Kit_DsdDecompose_rec(pNtk,pKVar14,uVar6,(unsigned_short *)pPar_00,nDecMux);
      pObj = pKVar15;
    }
  } while( true );
LAB_0055c43b:
  pKVar14 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,3);
  KVar7 = *pKVar14;
  puVar20 = (undefined4 *)(&pKVar14[1].field_0x0 + ((uint)KVar7 >> 8 & 0x3fc));
  if (((uint)KVar7 & 0x1c0) != 0x140) {
    puVar20 = (undefined4 *)0x0;
  }
  *puVar20 = 0xcacacaca;
  *pKVar14 = (Kit_DsdObj_t)
             (((uint)KVar7 & 0x3ffff) + ((int)KVar7 + 0x40000U & 0x3fc0000) + 0xc000000);
  *(undefined2 *)(pKVar14 + 1) = *(undefined2 *)((long)&pObj[1].field_0x0 + (long)(int)uVar9 * 2);
  *(undefined2 *)((long)&pObj[1].field_0x0 + (long)(int)uVar9 * 2) = 0x7f;
  *(undefined2 *)&pKVar14[1].field_0x2 =
       *(undefined2 *)((long)&pObj[1].field_0x0 + (long)(int)uVar18 * 2);
  *(undefined2 *)((long)&pObj[1].field_0x0 + (long)(int)uVar18 * 2) = 0x7f;
  local_d0 = local_d0 & ~(1 << ((byte)uVar18 & 0x1f) | 1 << (uVar9 & 0x1f));
  *(undefined2 *)(pKVar14 + 2) = *(undefined2 *)((long)&pObj[1].field_0x0 + (ulong)uVar24 * 2);
  *(ushort *)((long)&pObj[1].field_0x0 + (ulong)uVar24 * 2) = SUB42(*pKVar14,0) * 2 & 0x7e;
  Kit_TruthMuxVar(pTruth,pOut_02,pOut_03,(uint)*pObj >> 0x1a,uVar24);
  if (iVar31 < 1 && iVar26 < 1) {
    *(byte *)(pKVar14 + 1) = *(byte *)(pKVar14 + 1) ^ 1;
  }
  goto LAB_0055b97c;
}

Assistant:

void Kit_DsdDecompose_rec( Kit_DsdNtk_t * pNtk, Kit_DsdObj_t * pObj, unsigned uSupp, unsigned short * pPar, int nDecMux )
{
    Kit_DsdObj_t * pRes, * pRes0, * pRes1;
    int nWords = Kit_TruthWordNum(pObj->nFans);
    unsigned * pTruth = Kit_DsdObjTruth(pObj);
    unsigned * pCofs2[2] = { pNtk->pMem, pNtk->pMem + nWords };
    unsigned * pCofs4[2][2] = { {pNtk->pMem + 2 * nWords, pNtk->pMem + 3 * nWords}, {pNtk->pMem + 4 * nWords, pNtk->pMem + 5 * nWords} };
    int i, iLit0, iLit1, nFans0, nFans1, nPairs;
    int fEquals[2][2], fOppos, fPairs[4][4];
    unsigned j, k, nFansNew, uSupp0, uSupp1;

    assert( pObj->nFans > 0 );
    assert( pObj->Type == KIT_DSD_PRIME );
    assert( uSupp == (uSupp0 = (unsigned)Kit_TruthSupport(pTruth, pObj->nFans)) );

    // compress the truth table
    if ( uSupp != Kit_BitMask(pObj->nFans) )
    {
        nFansNew = Kit_WordCountOnes(uSupp);
        Kit_TruthShrink( pNtk->pMem, pTruth, nFansNew, pObj->nFans, uSupp, 1 );
        for ( j = k = 0; j < pObj->nFans; j++ )
            if ( uSupp & (1 << j) )
                pObj->pFans[k++] = pObj->pFans[j];
        assert( k == nFansNew );
        pObj->nFans = k;
        uSupp = Kit_BitMask(pObj->nFans);
    }

    // consider the single variable case
    if ( pObj->nFans == 1 )
    {
        pObj->Type = KIT_DSD_NONE;
        if ( pTruth[0] == 0x55555555 )
            pObj->pFans[0] = Abc_LitNot(pObj->pFans[0]);
        else
            assert( pTruth[0] == 0xAAAAAAAA );
        // update the parent pointer
        *pPar = Abc_LitNotCond( pObj->pFans[0], Abc_LitIsCompl(*pPar) );
        return;
    }

    // decompose the output
    if ( !pObj->fMark )
    for ( i = pObj->nFans - 1; i >= 0; i-- )
    {
        // get the two-variable cofactors
        Kit_TruthCofactor0New( pCofs2[0], pTruth, pObj->nFans, i );
        Kit_TruthCofactor1New( pCofs2[1], pTruth, pObj->nFans, i );
//        assert( !Kit_TruthVarInSupport( pCofs2[0], pObj->nFans, i) );
//        assert( !Kit_TruthVarInSupport( pCofs2[1], pObj->nFans, i) );
        // get the constant cofs
        fEquals[0][0] = Kit_TruthIsConst0( pCofs2[0], pObj->nFans );
        fEquals[0][1] = Kit_TruthIsConst0( pCofs2[1], pObj->nFans );
        fEquals[1][0] = Kit_TruthIsConst1( pCofs2[0], pObj->nFans );
        fEquals[1][1] = Kit_TruthIsConst1( pCofs2[1], pObj->nFans );
        fOppos        = Kit_TruthIsOpposite( pCofs2[0], pCofs2[1], pObj->nFans );
        assert( !Kit_TruthIsEqual(pCofs2[0], pCofs2[1], pObj->nFans) );
        if ( fEquals[0][0] + fEquals[0][1] + fEquals[1][0] + fEquals[1][1] + fOppos == 0 )
        {
            // check the MUX decomposition
            uSupp0 = Kit_TruthSupport( pCofs2[0], pObj->nFans );
            uSupp1 = Kit_TruthSupport( pCofs2[1], pObj->nFans );
            assert( uSupp == (uSupp0 | uSupp1 | (1<<i)) );
            if ( uSupp0 & uSupp1 )
                continue;
            // perform MUX decomposition
            pRes0 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
            pRes1 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
            for ( k = 0; k < pObj->nFans; k++ )
            {
                pRes0->pFans[k] = (uSupp0 & (1 << k))? pObj->pFans[k] : 127;
                pRes1->pFans[k] = (uSupp1 & (1 << k))? pObj->pFans[k] : 127;
            }
            Kit_TruthCopy( Kit_DsdObjTruth(pRes0), pCofs2[0], pObj->nFans );        
            Kit_TruthCopy( Kit_DsdObjTruth(pRes1), pCofs2[1], pObj->nFans ); 
            // update the current one
            assert( pObj->Type == KIT_DSD_PRIME );
            pTruth[0] = 0xCACACACA;
            pObj->nFans = 3;
            pObj->pFans[2] = pObj->pFans[i];
            pObj->pFans[0] = 2*pRes0->Id; pRes0->nRefs++;
            pObj->pFans[1] = 2*pRes1->Id; pRes1->nRefs++;
            // call recursively
            Kit_DsdDecompose_rec( pNtk, pRes0, uSupp0, pObj->pFans + 0, nDecMux );
            Kit_DsdDecompose_rec( pNtk, pRes1, uSupp1, pObj->pFans + 1, nDecMux );
            return;
        }

        // create the new node
        pRes = Kit_DsdObjAlloc( pNtk, KIT_DSD_AND, 2 );
        pRes->nRefs++;
        pRes->nFans = 2;
        pRes->pFans[0] = pObj->pFans[i];  pObj->pFans[i] = 127;  uSupp &= ~(1 << i);
        pRes->pFans[1] = 2*pObj->Id;
        // update the parent pointer
        *pPar = Abc_LitNotCond( 2 * pRes->Id, Abc_LitIsCompl(*pPar) );
        // consider different decompositions
        if ( fEquals[0][0] )
        {
            Kit_TruthCopy( pTruth, pCofs2[1], pObj->nFans );
        }
        else if ( fEquals[0][1] )
        {
            pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);
            Kit_TruthCopy( pTruth, pCofs2[0], pObj->nFans );
        }
        else if ( fEquals[1][0] )
        {
            *pPar = Abc_LitNot(*pPar);
            pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);
            Kit_TruthCopy( pTruth, pCofs2[1], pObj->nFans );
        }
        else if ( fEquals[1][1] )
        {
            *pPar = Abc_LitNot(*pPar);
            pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);  
            pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);
            Kit_TruthCopy( pTruth, pCofs2[0], pObj->nFans );
        }
        else if ( fOppos )
        {
            pRes->Type = KIT_DSD_XOR;
            Kit_TruthCopy( pTruth, pCofs2[0], pObj->nFans );
        }
        else
            assert( 0 );
        // decompose the remainder
        assert( Kit_DsdObjTruth(pObj) == pTruth );
        Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pRes->pFans + 1, nDecMux );
        return;
    }
    pObj->fMark = 1;

    // decompose the input
    for ( i = pObj->nFans - 1; i >= 0; i-- )
    {
        assert( Kit_TruthVarInSupport( pTruth, pObj->nFans, i ) );
        // get the single variale cofactors
        Kit_TruthCofactor0New( pCofs2[0], pTruth, pObj->nFans, i );
        Kit_TruthCofactor1New( pCofs2[1], pTruth, pObj->nFans, i );
        // check the existence of MUX decomposition
        uSupp0 = Kit_TruthSupport( pCofs2[0], pObj->nFans );
        uSupp1 = Kit_TruthSupport( pCofs2[1], pObj->nFans );
        assert( uSupp == (uSupp0 | uSupp1 | (1<<i)) );
        // if one of the cofs is a constant, it is time to check the output again
        if ( uSupp0 == 0 || uSupp1 == 0 )
        {
            pObj->fMark = 0;
            Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pPar, nDecMux );
            return;
        }
        assert( uSupp0 && uSupp1 );
        // get the number of unique variables
        nFans0 = Kit_WordCountOnes( uSupp0 & ~uSupp1 );
        nFans1 = Kit_WordCountOnes( uSupp1 & ~uSupp0 );
        if ( nFans0 == 1 && nFans1 == 1 )
        {
            // get the cofactors w.r.t. the unique variables
            iLit0 = Kit_WordFindFirstBit( uSupp0 & ~uSupp1 );
            iLit1 = Kit_WordFindFirstBit( uSupp1 & ~uSupp0 );
            // get four cofactors                                        
            Kit_TruthCofactor0New( pCofs4[0][0], pCofs2[0], pObj->nFans, iLit0 );
            Kit_TruthCofactor1New( pCofs4[0][1], pCofs2[0], pObj->nFans, iLit0 );
            Kit_TruthCofactor0New( pCofs4[1][0], pCofs2[1], pObj->nFans, iLit1 );
            Kit_TruthCofactor1New( pCofs4[1][1], pCofs2[1], pObj->nFans, iLit1 );
            // check existence conditions
            fEquals[0][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][0], pObj->nFans );
            fEquals[0][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][1], pObj->nFans );
            fEquals[1][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][1], pObj->nFans );
            fEquals[1][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][0], pObj->nFans );
            if ( (fEquals[0][0] && fEquals[0][1]) || (fEquals[1][0] && fEquals[1][1]) )
            {
                // construct the MUX
                pRes = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, 3 );
                Kit_DsdObjTruth(pRes)[0] = 0xCACACACA;
                pRes->nRefs++;
                pRes->nFans = 3;
                pRes->pFans[0] = pObj->pFans[iLit0]; pObj->pFans[iLit0] = 127;  uSupp &= ~(1 << iLit0);
                pRes->pFans[1] = pObj->pFans[iLit1]; pObj->pFans[iLit1] = 127;  uSupp &= ~(1 << iLit1);
                pRes->pFans[2] = pObj->pFans[i];     pObj->pFans[i] = 2 * pRes->Id; // remains in support
                // update the node
//                if ( fEquals[0][0] && fEquals[0][1] )
//                    Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[0][1], pObj->nFans, i );
//                else
//                    Kit_TruthMuxVar( pTruth, pCofs4[0][1], pCofs4[0][0], pObj->nFans, i );
                Kit_TruthMuxVar( pTruth, pCofs4[1][0], pCofs4[1][1], pObj->nFans, i );
                if ( fEquals[1][0] && fEquals[1][1] )
                    pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);
                // decompose the remainder
                Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pPar, nDecMux );
                return;
            }
        }

        // try other inputs
        for ( k = i+1; k < pObj->nFans; k++ )
        {
            // get four cofactors                                                ik
            Kit_TruthCofactor0New( pCofs4[0][0], pCofs2[0], pObj->nFans, k ); // 00 
            Kit_TruthCofactor1New( pCofs4[0][1], pCofs2[0], pObj->nFans, k ); // 01 
            Kit_TruthCofactor0New( pCofs4[1][0], pCofs2[1], pObj->nFans, k ); // 10 
            Kit_TruthCofactor1New( pCofs4[1][1], pCofs2[1], pObj->nFans, k ); // 11 
            // compare equal pairs
            fPairs[0][1] = fPairs[1][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[0][1], pObj->nFans );
            fPairs[0][2] = fPairs[2][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][0], pObj->nFans );
            fPairs[0][3] = fPairs[3][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][1], pObj->nFans );
            fPairs[1][2] = fPairs[2][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][0], pObj->nFans );
            fPairs[1][3] = fPairs[3][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][1], pObj->nFans );
            fPairs[2][3] = fPairs[3][2] = Kit_TruthIsEqual( pCofs4[1][0], pCofs4[1][1], pObj->nFans );
            nPairs = fPairs[0][1] + fPairs[0][2] + fPairs[0][3] + fPairs[1][2] + fPairs[1][3] + fPairs[2][3];
            if ( nPairs != 3 && nPairs != 2 )
                continue;

            // decomposition exists
            pRes = Kit_DsdObjAlloc( pNtk, KIT_DSD_AND, 2 );
            pRes->nRefs++;
            pRes->nFans = 2;
            pRes->pFans[0] = pObj->pFans[k]; pObj->pFans[k] = 2 * pRes->Id;  // remains in support
            pRes->pFans[1] = pObj->pFans[i]; pObj->pFans[i] = 127;       uSupp &= ~(1 << i);
            if ( !fPairs[0][1] && !fPairs[0][2] && !fPairs[0][3] ) // 00
            {
                pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);  
                pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);
                Kit_TruthMuxVar( pTruth, pCofs4[1][1], pCofs4[0][0], pObj->nFans, k );
            }
            else if ( !fPairs[1][0] && !fPairs[1][2] && !fPairs[1][3] ) // 01
            {
                pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);  
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[0][1], pObj->nFans, k );
            }
            else if ( !fPairs[2][0] && !fPairs[2][1] && !fPairs[2][3] ) // 10
            {
                pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);  
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[1][0], pObj->nFans, k );
            }
            else if ( !fPairs[3][0] && !fPairs[3][1] && !fPairs[3][2] ) // 11
            {
//                unsigned uSupp0 = Kit_TruthSupport(pCofs4[0][0], pObj->nFans);
//                unsigned uSupp1 = Kit_TruthSupport(pCofs4[1][1], pObj->nFans);
//                unsigned uSupp;
//                Extra_PrintBinary( stdout, &uSupp0, pObj->nFans ); printf( "\n" );
//                Extra_PrintBinary( stdout, &uSupp1, pObj->nFans ); printf( "\n" );
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[1][1], pObj->nFans, k );
//                uSupp = Kit_TruthSupport(pTruth, pObj->nFans);
//                Extra_PrintBinary( stdout, &uSupp, pObj->nFans ); printf( "\n" ); printf( "\n" );
            }
            else
            {
                assert( fPairs[0][3] && fPairs[1][2] );
                pRes->Type = KIT_DSD_XOR;;
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[0][1], pObj->nFans, k );
            }
            // decompose the remainder
            Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pPar, nDecMux );
            return;
        }
    }

    // if all decomposition methods failed and we are still above the limit, perform MUX-decomposition
    if ( nDecMux > 0 && (int)pObj->nFans > nDecMux )
    {
        int iBestVar = Kit_TruthBestCofVar( pTruth, pObj->nFans, pCofs2[0], pCofs2[1] );
        uSupp0 = Kit_TruthSupport( pCofs2[0], pObj->nFans );
        uSupp1 = Kit_TruthSupport( pCofs2[1], pObj->nFans );
        // perform MUX decomposition
        pRes0 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
        pRes1 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
        for ( k = 0; k < pObj->nFans; k++ )
            pRes0->pFans[k] = pRes1->pFans[k] = pObj->pFans[k];
        Kit_TruthCopy( Kit_DsdObjTruth(pRes0), pCofs2[0], pObj->nFans );        
        Kit_TruthCopy( Kit_DsdObjTruth(pRes1), pCofs2[1], pObj->nFans ); 
        // update the current one
        assert( pObj->Type == KIT_DSD_PRIME );
        pTruth[0] = 0xCACACACA;
        pObj->nFans = 3;
        pObj->pFans[2] = pObj->pFans[iBestVar];
        pObj->pFans[0] = 2*pRes0->Id; pRes0->nRefs++;
        pObj->pFans[1] = 2*pRes1->Id; pRes1->nRefs++;
        // call recursively
        Kit_DsdDecompose_rec( pNtk, pRes0, uSupp0, pObj->pFans + 0, nDecMux );
        Kit_DsdDecompose_rec( pNtk, pRes1, uSupp1, pObj->pFans + 1, nDecMux );
    }

}